

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O1

XML_Error doIgnoreSection(XML_Parser parser,ENCODING *enc,char **startPtr,char *end,char **nextPtr)

{
  char *s;
  int iVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  char *next;
  char *local_38;
  
  s = *startPtr;
  if (*(ENCODING **)((long)parser + 0x118) == enc) {
    puVar3 = (undefined8 *)((long)parser + 0x218);
    *(char **)((long)parser + 0x218) = s;
    puVar2 = (undefined8 *)((long)parser + 0x220);
  }
  else {
    puVar3 = *(undefined8 **)((long)parser + 0x230);
    puVar2 = puVar3 + 1;
  }
  *puVar3 = s;
  *startPtr = (char *)0x0;
  iVar1 = (*enc->scanners[3])(enc,s,end,&local_38);
  *puVar2 = local_38;
  switch(iVar1) {
  case 0:
    *puVar3 = local_38;
    return XML_ERROR_INVALID_TOKEN;
  case -4:
  case -1:
    if (nextPtr == (char **)0x0) {
      return XML_ERROR_SYNTAX;
    }
    break;
  case -2:
    if (nextPtr == (char **)0x0) {
      return XML_ERROR_PARTIAL_CHAR;
    }
    break;
  default:
    if (iVar1 == 0x2a) {
      if (*(long *)((long)parser + 0xa0) != 0) {
        reportDefault(parser,enc,s,local_38);
      }
      *startPtr = local_38;
      return XML_ERROR_NONE;
    }
  case -3:
    *puVar3 = local_38;
    return XML_ERROR_UNEXPECTED_STATE;
  }
  *nextPtr = s;
  return XML_ERROR_NONE;
}

Assistant:

static
enum XML_Error doIgnoreSection(XML_Parser parser,
                               const ENCODING *enc,
                               const char **startPtr,
                               const char *end,
                               const char **nextPtr)
{
  const char *next;
  int tok;
  const char *s = *startPtr;
  const char **eventPP;
  const char **eventEndPP;
  if (enc == encoding) {
    eventPP = &eventPtr;
    *eventPP = s;
    eventEndPP = &eventEndPtr;
  }
  else {
    eventPP = &(openInternalEntities->internalEventPtr);
    eventEndPP = &(openInternalEntities->internalEventEndPtr);
  }
  *eventPP = s;
  *startPtr = 0;
  tok = XmlIgnoreSectionTok(enc, s, end, &next);
  *eventEndPP = next;
  switch (tok) {
  case XML_TOK_IGNORE_SECT:
    if (defaultHandler)
      reportDefault(parser, enc, s, next);
    *startPtr = next;
    return XML_ERROR_NONE;
  case XML_TOK_INVALID:
    *eventPP = next;
    return XML_ERROR_INVALID_TOKEN;
  case XML_TOK_PARTIAL_CHAR:
    if (nextPtr) {
      *nextPtr = s;
      return XML_ERROR_NONE;
    }
    return XML_ERROR_PARTIAL_CHAR;
  case XML_TOK_PARTIAL:
  case XML_TOK_NONE:
    if (nextPtr) {
      *nextPtr = s;
      return XML_ERROR_NONE;
    }
    return XML_ERROR_SYNTAX; /* XML_ERROR_UNCLOSED_IGNORE_SECTION */
  default:
    *eventPP = next;
    return XML_ERROR_UNEXPECTED_STATE;
  }
  /* not reached */
}